

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatMap.h
# Opt level: O2

FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_> * __thiscall
FlatMap<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>,_std::less<unsigned_long>_>
::operator[](FlatMap<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>,_std::less<unsigned_long>_>
             *this,unsigned_long *key)

{
  __normal_iterator<std::pair<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>_>_*,_std::vector<std::pair<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>_>_>_>_>
  __position;
  tuple<> local_19;
  tuple<const_unsigned_long_&> local_18;
  
  __position = std::
               __lower_bound<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,FlatMap<unsigned_int,sf::Drawable_const*,std::less<unsigned_int>>>*,std::vector<std::pair<unsigned_long,FlatMap<unsigned_int,sf::Drawable_const*,std::less<unsigned_int>>>,std::allocator<std::pair<unsigned_long,FlatMap<unsigned_int,sf::Drawable_const*,std::less<unsigned_int>>>>>>,unsigned_long,__gnu_cxx::__ops::_Iter_comp_val<FlatMap<unsigned_long,FlatMap<unsigned_int,sf::Drawable_const*,std::less<unsigned_int>>,std::less<unsigned_long>>::ValueToKeyComparator>>
                         ((this->vec_).
                          super__Vector_base<std::pair<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->vec_).
                          super__Vector_base<std::pair<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,key);
  if ((__position._M_current ==
       (this->vec_).
       super__Vector_base<std::pair<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) || (*key < (__position._M_current)->first)) {
    local_18.super__Tuple_impl<0UL,_const_unsigned_long_&>.
    super__Head_base<0UL,_const_unsigned_long_&,_false>._M_head_impl =
         (_Tuple_impl<0UL,_const_unsigned_long_&>)(_Tuple_impl<0UL,_const_unsigned_long_&>)key;
    __position._M_current =
         (pair<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>_>
          *)std::
            vector<std::pair<unsigned_long,FlatMap<unsigned_int,sf::Drawable_const*,std::less<unsigned_int>>>,std::allocator<std::pair<unsigned_long,FlatMap<unsigned_int,sf::Drawable_const*,std::less<unsigned_int>>>>>
            ::
            _M_emplace_aux<std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                      ((vector<std::pair<unsigned_long,FlatMap<unsigned_int,sf::Drawable_const*,std::less<unsigned_int>>>,std::allocator<std::pair<unsigned_long,FlatMap<unsigned_int,sf::Drawable_const*,std::less<unsigned_int>>>>>
                        *)this,__position._M_current,
                       (piecewise_construct_t *)&std::piecewise_construct,&local_18,&local_19);
  }
  return &(__position._M_current)->second;
}

Assistant:

T& operator[](const Key& key) {
        auto pos = std::lower_bound(vec_.begin(), vec_.end(), key, valueToKeyComp_);
        if (pos == vec_.end() || comp_(key, pos->first)) {
            return vec_.emplace(pos, std::piecewise_construct, std::forward_as_tuple(key), std::tuple<>())->second;
        } else {
            return pos->second;
        }
    }